

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,int num_digits,string_view prefix,
          format_specs specs,bin_writer<3> f)

{
  ulong uVar1;
  ulong uVar2;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  local_68;
  
  local_68.prefix.size_ = prefix.size_;
  local_68.prefix.data_ = prefix.data_;
  uVar2 = (uint)num_digits + local_68.prefix.size_;
  local_68.size_ = uVar2;
  local_68.fill = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    uVar1 = (ulong)(uint)specs.width;
    local_68.padding = 0;
    if (uVar2 <= uVar1) {
      local_68.size_ = uVar1;
      local_68.padding = uVar1 - uVar2;
    }
  }
  else if (num_digits < specs.precision) {
    local_68.size_ = (uint)specs.precision + local_68.prefix.size_;
    local_68.fill = '0';
    local_68.padding = (ulong)(uint)(specs.precision - num_digits);
  }
  else {
    local_68.padding = 0;
  }
  if (((undefined1  [20])specs & (undefined1  [20])0xf00) == (undefined1  [20])0x0) {
    specs._9_1_ = specs._9_1_ | 2;
  }
  local_68.f.abs_value._0_8_ = (undefined8)f.abs_value;
  local_68.f.abs_value._8_8_ = f.abs_value._8_8_;
  local_68.f.num_digits = f.num_digits;
  local_68.f._20_4_ = f._20_4_;
  local_68.f._24_8_ = f._24_8_;
  write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<3>>>
            (this,&specs,&local_68);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }